

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double __thiscall
units::detail::otherUsefulConversions<units::unit,units::precise_unit>
          (detail *this,double val,unit *start,precise_unit *result)

{
  unit *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double __x;
  double __x_00;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  unit local_78;
  unit local_70;
  unit local_68;
  unit_data local_60;
  unit_data local_5c;
  unit_data local_58;
  unit_data local_54;
  unit local_50;
  unit local_48;
  unit_data local_40;
  unit_data local_3c;
  unit_data local_38;
  unit_data local_34;
  unit_data local_30;
  unit_data local_2c;
  precise_unit *local_28;
  precise_unit *result_local;
  unit *start_local;
  double val_local;
  
  local_28 = (precise_unit *)start;
  result_local = (precise_unit *)this;
  start_local = (unit *)val;
  local_2c = unit::base_units((unit *)this);
  iVar3 = unit_data::kg(&local_2c);
  local_30 = precise_unit::base_units(local_28);
  iVar4 = unit_data::kg(&local_30);
  if (iVar3 == iVar4) {
    local_38 = unit::base_units((unit *)result_local);
    local_3c = precise_unit::base_units(local_28);
    local_34 = unit_data::operator/(&local_38,&local_3c);
    unit::pow((unit *)&units::s,__x,in_XMM1_Qa);
    local_48 = unit::operator/((unit *)&units::m,&local_50);
    local_40 = unit::base_units(&local_48);
    bVar2 = unit_data::has_same_base(&local_34,&local_40);
    puVar1 = start_local;
    if (bVar2) {
      dVar6 = unit::multiplier((unit *)result_local);
      dVar5 = precise_unit::multiplier(local_28);
      return (((double)puVar1 * dVar6) / 9.80665) / dVar5;
    }
    local_58 = precise_unit::base_units(local_28);
    local_5c = unit::base_units((unit *)result_local);
    local_54 = unit_data::operator/(&local_58,&local_5c);
    unit::pow((unit *)&units::s,__x_00,in_XMM1_Qa);
    local_68 = unit::operator/((unit *)&units::m,&local_70);
    local_60 = unit::base_units(&local_68);
    bVar2 = unit_data::has_same_base(&local_54,&local_60);
    puVar1 = start_local;
    if (bVar2) {
      dVar6 = unit::multiplier((unit *)result_local);
      dVar5 = precise_unit::multiplier(local_28);
      return ((double)puVar1 * dVar6 * 9.80665) / dVar5;
    }
  }
  local_78 = unit_cast((unit *)result_local);
  bVar2 = unit::operator==(&local_78,(unit *)&kilo);
  if (bVar2) {
    bVar2 = precise_unit::has_same_base(local_28,(unit *)&kg);
    if (bVar2) {
      dVar6 = convert<units::unit,units::precise_unit>((double)start_local,(unit *)&kg,local_28);
      return dVar6;
    }
    bVar2 = precise_unit::has_same_base(local_28,(unit *)&units::m);
    if (bVar2) {
      dVar6 = convert<units::unit,units::precise_unit>((double)start_local,(unit *)&km,local_28);
      return dVar6;
    }
  }
  return NAN;
}

Assistant:

inline double
        otherUsefulConversions(double val, const UX& start, const UX2& result)
    {
        if (start.base_units().kg() == result.base_units().kg()) {
            if ((start.base_units() / result.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // weight to mass
                return val * start.multiplier() / constants::standard_gravity /
                    result.multiplier();
            }
            if ((result.base_units() / start.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // mass to weight
                return val * start.multiplier() * constants::standard_gravity /
                    result.multiplier();
            }
        }
        if (unit_cast(start) == kilo) {
            if (result.has_same_base(kg)) {
                return convert(val, kg, result);
            }
            if (result.has_same_base(m)) {
                return convert(val, km, result);
            }
        }
        return constants::invalid_conversion;
    }